

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void * mi_new_nothrow(size_t size)

{
  void *pvVar1;
  undefined1 in_SIL;
  
  pvVar1 = mi_malloc(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  pvVar1 = mi_try_new(size,(_Bool)in_SIL);
  return pvVar1;
}

Assistant:

void* mi_new_nothrow(size_t size) mi_attr_noexcept {
  void* p = mi_malloc(size);
  if mi_unlikely(p == NULL) return mi_try_new(size, true);
  return p;
}